

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O0

uint32_t __thiscall
bits::detail::
RadixSort<8U,_unsigned_int,_unsigned_int,_bits::detail::FloatFlip,_bits::detail::InvFloatFlip>::
operator()(RadixSort<8U,_unsigned_int,_unsigned_int,_bits::detail::FloatFlip,_bits::detail::InvFloatFlip>
           *this,uint *keys_in,uint *keys_temp,uint *values_in,uint *values_temp,uint32_t size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_R8;
  uint in_R9D;
  uint32_t in_2;
  uint32_t bucket_5;
  uint32_t in_1;
  uint32_t bucket_4;
  uint32_t in;
  uint32_t bucket_3;
  uint32_t out;
  uint *values [2];
  uint *keys [2];
  uint32_t bucket_2;
  uint32_t i_1;
  uint32_t tsum;
  uint32_t bucket_1;
  uint32_t sum [4];
  uint32_t pos;
  uint32_t shift;
  uint32_t bucket;
  uint key;
  uint32_t i;
  uint32_t hist [4] [256];
  PassThrough pass_through;
  InvFloatFlip encode_op;
  FloatFlip decode_op;
  uint local_10ac;
  long local_1098 [4];
  uint local_1078;
  uint local_1074;
  int local_1070;
  uint local_106c;
  int aiStack_1068 [7];
  uint local_104c;
  int local_1048;
  uint local_1044;
  uint32_t local_1040;
  uint local_103c;
  int local_1038 [768];
  undefined1 auStack_438 [1035];
  FloatFlip local_2d;
  uint local_2c;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_1038,0,0x1000);
  for (local_103c = 0; local_103c < local_2c; local_103c = local_103c + 1) {
    local_1040 = FloatFlip::operator()(&local_2d,*(uint32_t *)(local_10 + (ulong)local_103c * 4));
    for (local_1044 = 0; local_1044 < 4; local_1044 = local_1044 + 1) {
      local_1048 = local_1044 << 3;
      local_104c = local_1040 >> ((byte)(local_1044 << 3) & 0x1f) & 0xff;
      local_1038[(ulong)local_1044 * 0x100 + (ulong)local_104c] =
           local_1038[(ulong)local_1044 * 0x100 + (ulong)local_104c] + 1;
    }
  }
  for (local_106c = 0; local_106c < 4; local_106c = local_106c + 1) {
    aiStack_1068[local_106c] = local_1038[(ulong)local_106c * 0x100];
    local_1038[(ulong)local_106c * 0x100] = 0;
  }
  for (local_1074 = 1; local_1074 < 0x100; local_1074 = local_1074 + 1) {
    for (local_1078 = 0; local_1078 < 4; local_1078 = local_1078 + 1) {
      iVar1 = local_1038[(ulong)local_1078 * 0x100 + (ulong)local_1074];
      iVar2 = aiStack_1068[local_1078];
      local_1070 = iVar1 + iVar2;
      local_1038[(ulong)local_1078 * 0x100 + (ulong)local_1074] = aiStack_1068[local_1078];
      aiStack_1068[local_1078] = iVar1 + iVar2;
    }
  }
  local_1098[2] = local_10;
  local_1098[3] = local_18;
  local_1098[0] = local_20;
  local_1098[1] = local_28;
  RadixSort<8u,unsigned_int,unsigned_int,bits::detail::FloatFlip,bits::detail::InvFloatFlip>::
  radix_pass<bits::detail::FloatFlip,bits::detail::PassThrough>
            (local_10,local_18,local_20,local_28,local_2c,local_1038,0);
  for (local_10ac = 1; local_10ac < 3; local_10ac = local_10ac + 1) {
    uVar3 = local_10ac & 1;
    uVar4 = (uint)((uVar3 != 0 ^ 0xffU) & 1);
    RadixSort<8u,unsigned_int,unsigned_int,bits::detail::FloatFlip,bits::detail::InvFloatFlip>::
    radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
              (local_1098[(ulong)uVar3 + 2],local_1098[(ulong)uVar4 + 2],local_1098[uVar3],
               local_1098[uVar4],local_2c,local_1038 + (ulong)local_10ac * 0x100,local_10ac << 3);
  }
  RadixSort<8u,unsigned_int,unsigned_int,bits::detail::FloatFlip,bits::detail::InvFloatFlip>::
  radix_pass<bits::detail::PassThrough,bits::detail::InvFloatFlip>
            (local_1098[3],local_1098[2],local_1098[1],local_1098[0],local_2c,auStack_438,0x18);
  return 0;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }